

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkReadNodeNames(Abc_Ntk_t *pNtk,char *pFileName)

{
  FILE *__stream;
  char *pcVar1;
  Abc_Obj_t *Entry;
  Abc_Obj_t *pObj;
  char *pToken;
  FILE *pFile;
  Vec_Ptr_t *vNodes;
  char Buffer [1000];
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  Buffer._992_8_ = pFileName;
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open node list \"%s\".\n",Buffer._992_8_);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    pNtk_local = (Abc_Ntk_t *)Vec_PtrAlloc(100);
    while (pcVar1 = fgets((char *)&vNodes,1000,__stream), pcVar1 != (char *)0x0) {
      pObj = (Abc_Obj_t *)strtok((char *)&vNodes," \n\r\t");
      while (pObj != (Abc_Obj_t *)0x0) {
        Entry = Abc_NtkFindNode(pNtk,(char *)pObj);
        if (Entry == (Abc_Obj_t *)0x0) {
          printf("Cannot find node \"%s\".\n",pObj);
          Vec_PtrFree((Vec_Ptr_t *)pNtk_local);
          fclose(__stream);
          return (Vec_Ptr_t *)0x0;
        }
        Vec_PtrPush((Vec_Ptr_t *)pNtk_local,Entry);
        pObj = (Abc_Obj_t *)strtok((char *)0x0," \n\r\t");
      }
    }
    fclose(__stream);
  }
  return (Vec_Ptr_t *)pNtk_local;
}

Assistant:

Vec_Ptr_t * Abc_NtkReadNodeNames( Abc_Ntk_t * pNtk, char * pFileName )
{
    char Buffer[1000];
    Vec_Ptr_t * vNodes = NULL;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open node list \"%s\".\n", pFileName );
        return NULL;
    }
    vNodes = Vec_PtrAlloc( 100 );
    while ( fgets(Buffer, 1000, pFile) != NULL ) 
    {
        char * pToken = strtok( Buffer, " \n\r\t" );
        while ( pToken )
        {
            Abc_Obj_t * pObj = Abc_NtkFindNode( pNtk, pToken );
            if ( pObj == NULL )
            {
                printf( "Cannot find node \"%s\".\n", pToken );
                Vec_PtrFree( vNodes );
                fclose( pFile );
                return NULL;
            }
            Vec_PtrPush( vNodes, pObj );
            pToken = strtok( NULL, " \n\r\t" );
        }
    }
    fclose( pFile );
    return vNodes;
}